

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O2

strbuf * pockle_mpu(Pockle *pockle,mp_int *p)

{
  PocklePrimeRecord *pPVar1;
  strbuf *sb;
  void *pvVar2;
  void *__s;
  size_t sVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  char *fmt;
  BinarySink *bs;
  size_t sVar6;
  bool bVar7;
  
  sb = strbuf_new_nm();
  pvVar2 = find234(pockle->tree,p,ppr_find);
  if (pvVar2 == (void *)0x0) {
    __assert_fail("pr",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                  ,0x197,"strbuf *pockle_mpu(Pockle *, mp_int *)");
  }
  __s = safemalloc(pockle->nlist,1,0);
  memset(__s,0,pockle->nlist);
  *(undefined1 *)((long)__s + *(long *)((long)pvVar2 + 0x20)) = 1;
  bs = sb->binarysink_;
  BinarySink_put_fmt(bs,"[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\nProof for:\nN  ");
  mp_write_decimal(sb,p);
  BinarySink_put_fmt(bs,"\n");
  sVar6 = pockle->nlist;
  do {
    do {
      bVar7 = sVar6 == 0;
      sVar6 = sVar6 - 1;
      if (bVar7) {
        safefree(__s);
        return sb;
      }
    } while (*(char *)((long)__s + sVar6) != '\x01');
    pPVar1 = pockle->list[sVar6];
    sVar3 = mp_get_nbits(pPVar1->prime);
    if (sVar3 < 0x41) {
      BinarySink_put_fmt(bs,"\nType Small\nN  ");
      mp_write_decimal(sb,pPVar1->prime);
      fmt = "\n";
    }
    else {
      if (pPVar1->witness == (mp_int *)0x0) {
        __assert_fail("pr->witness",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                      ,0x1ac,"strbuf *pockle_mpu(Pockle *, mp_int *)");
      }
      BinarySink_put_fmt(bs,"\nType BLS5\nN  ");
      mp_write_decimal(sb,pPVar1->prime);
      BinarySink_put_fmt(bs,"\n");
      uVar5 = 0;
      while (uVar4 = pPVar1->nfactors, uVar5 < uVar4) {
        BinarySink_put_fmt(bs,"Q[%zu]  ",uVar5 + 1);
        mp_write_decimal(sb,pPVar1->factors[uVar5]->prime);
        uVar4 = pPVar1->factors[uVar5]->index;
        if (sVar6 <= uVar4) {
          __assert_fail("pr->factors[i]->index < index",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                        ,0x1b3,"strbuf *pockle_mpu(Pockle *, mp_int *)");
        }
        *(undefined1 *)((long)__s + uVar4) = 1;
        BinarySink_put_fmt(bs,"\n");
        uVar5 = uVar5 + 1;
      }
      for (uVar5 = 0; uVar5 < uVar4 + 1; uVar5 = uVar5 + 1) {
        BinarySink_put_fmt(bs,"A[%zu]  ",uVar5);
        mp_write_decimal(sb,pPVar1->witness);
        BinarySink_put_fmt(bs,"\n");
        uVar4 = pPVar1->nfactors;
      }
      fmt = "----\n";
    }
    BinarySink_put_fmt(bs,fmt);
  } while( true );
}

Assistant:

strbuf *pockle_mpu(Pockle *pockle, mp_int *p)
{
    strbuf *sb = strbuf_new_nm();
    PocklePrimeRecord *pr = find234(pockle->tree, p, ppr_find);
    assert(pr);

    bool *needed = snewn(pockle->nlist, bool);
    memset(needed, 0, pockle->nlist * sizeof(bool));
    needed[pr->index] = true;

    put_fmt(sb, "[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\n"
            "Proof for:\nN  ");
    mp_write_decimal(sb, p);
    put_fmt(sb, "\n");

    for (size_t index = pockle->nlist; index-- > 0 ;) {
        if (!needed[index])
            continue;
        pr = pockle->list[index];

        if (mp_get_nbits(pr->prime) <= 64) {
            put_fmt(sb, "\nType Small\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
        } else {
            assert(pr->witness);
            put_fmt(sb, "\nType BLS5\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
            for (size_t i = 0; i < pr->nfactors; i++) {
                put_fmt(sb, "Q[%"SIZEu"]  ", i+1);
                mp_write_decimal(sb, pr->factors[i]->prime);
                assert(pr->factors[i]->index < index);
                needed[pr->factors[i]->index] = true;
                put_fmt(sb, "\n");
            }
            for (size_t i = 0; i < pr->nfactors + 1; i++) {
                put_fmt(sb, "A[%"SIZEu"]  ", i);
                mp_write_decimal(sb, pr->witness);
                put_fmt(sb, "\n");
            }
            put_fmt(sb, "----\n");
        }
    }
    sfree(needed);

    return sb;
}